

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

bool __thiscall Minisat::Solver::simplify(Solver *this)

{
  int iVar1;
  CRef CVar2;
  Size SVar3;
  int *piVar4;
  char *pcVar5;
  Lit *pLVar6;
  Lit *pLVar7;
  int local_2c;
  int i_2;
  int local_20;
  int j;
  int i;
  int i_1;
  Solver *this_local;
  
  iVar1 = decisionLevel(this);
  if (iVar1 != 0) {
    __assert_fail("decisionLevel() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                  ,0x283,"bool Minisat::Solver::simplify()");
  }
  if (((this->ok & 1U) != 0) && (CVar2 = propagate(this), CVar2 == 0xffffffff)) {
    iVar1 = nAssigns(this);
    if ((iVar1 != this->simpDB_assigns) && (this->simpDB_props < 1)) {
      removeSatisfied(this,&this->learnts);
      if ((this->remove_satisfied & 1U) != 0) {
        removeSatisfied(this,&this->clauses);
        for (j = 0; SVar3 = vec<int,_int>::size(&this->released_vars), j < SVar3; j = j + 1) {
          piVar4 = vec<int,_int>::operator[](&this->released_vars,j);
          pcVar5 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                             (&(this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,
                              *piVar4);
          if (*pcVar5 != '\0') {
            __assert_fail("seen[released_vars[i]] == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                          ,0x294,"bool Minisat::Solver::simplify()");
          }
          piVar4 = vec<int,_int>::operator[](&this->released_vars,j);
          pcVar5 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                             (&(this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,
                              *piVar4);
          *pcVar5 = '\x01';
        }
        i_2 = 0;
        for (local_20 = 0; SVar3 = vec<Minisat::Lit,_int>::size(&this->trail), local_20 < SVar3;
            local_20 = local_20 + 1) {
          pLVar6 = vec<Minisat::Lit,_int>::operator[](&this->trail,local_20);
          iVar1 = var((Lit)pLVar6->x);
          pcVar5 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                             (&(this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,
                              iVar1);
          if (*pcVar5 == '\0') {
            pLVar6 = vec<Minisat::Lit,_int>::operator[](&this->trail,local_20);
            pLVar7 = vec<Minisat::Lit,_int>::operator[](&this->trail,i_2);
            pLVar7->x = pLVar6->x;
            i_2 = i_2 + 1;
          }
        }
        vec<Minisat::Lit,_int>::shrink(&this->trail,local_20 - i_2);
        SVar3 = vec<Minisat::Lit,_int>::size(&this->trail);
        this->qhead = SVar3;
        for (local_2c = 0; SVar3 = vec<int,_int>::size(&this->released_vars), local_2c < SVar3;
            local_2c = local_2c + 1) {
          piVar4 = vec<int,_int>::operator[](&this->released_vars,local_2c);
          pcVar5 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                             (&(this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,
                              *piVar4);
          *pcVar5 = '\0';
        }
        append<int>(&this->released_vars,&this->free_vars);
        vec<int,_int>::clear(&this->released_vars,false);
      }
      checkGarbage(this);
      rebuildOrderHeap(this);
      iVar1 = nAssigns(this);
      this->simpDB_assigns = iVar1;
      this->simpDB_props = this->clauses_literals + this->learnts_literals;
      return true;
    }
    return true;
  }
  this->ok = false;
  return false;
}

Assistant:

bool Solver::simplify()
{
    assert(decisionLevel() == 0);

    if (!ok || propagate() != CRef_Undef)
        return ok = false;

    if (nAssigns() == simpDB_assigns || (simpDB_props > 0))
        return true;

    // Remove satisfied clauses:
    removeSatisfied(learnts);
    if (remove_satisfied){       // Can be turned off.
        removeSatisfied(clauses);

        // TODO: what todo in if 'remove_satisfied' is false?

        // Remove all released variables from the trail:
        for (int i = 0; i < released_vars.size(); i++){
            assert(seen[released_vars[i]] == 0);
            seen[released_vars[i]] = 1;
        }

        int i, j;
        for (i = j = 0; i < trail.size(); i++)
            if (seen[var(trail[i])] == 0)
                trail[j++] = trail[i];
        trail.shrink(i - j);
        //printf("trail.size()= %d, qhead = %d\n", trail.size(), qhead);
        qhead = trail.size();

        for (int i = 0; i < released_vars.size(); i++)
            seen[released_vars[i]] = 0;

        // Released variables are now ready to be reused:
        append(released_vars, free_vars);
        released_vars.clear();
    }
    checkGarbage();
    rebuildOrderHeap();

    simpDB_assigns = nAssigns();
    simpDB_props   = clauses_literals + learnts_literals;   // (shouldn't depend on stats really, but it will do for now)

    return true;
}